

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QList<QLocale::Country> * QLocale::countriesForLanguage(Language language)

{
  bool bVar1;
  const_iterator o;
  QList<QLocale::Country> *in_RDI;
  long in_FS_OFFSET;
  Territory in_stack_0000001a;
  Script in_stack_0000001c;
  Language in_stack_0000001e;
  QLocale *locale;
  QList<QLocale> *__range1;
  QList<QLocale::Country> *result;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QLocale> locales;
  parameter_type in_stack_ffffffffffffff4e;
  QList<QLocale> *in_stack_ffffffffffffff50;
  QList<QLocale::Country> *this;
  QList<QLocale::Country> *asize;
  const_iterator local_30;
  QList<QLocale> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QList<QLocale::Country> *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QLocale *)&DAT_aaaaaaaaaaaaaaaa;
  asize = in_RDI;
  matchingLocales(in_stack_0000001e,in_stack_0000001c,in_stack_0000001a);
  (in_RDI->d).size = (qsizetype)this;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (Country *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QLocale::Country>::QList((QList<QLocale::Country> *)0x4d1b49);
  QList<QLocale>::size(&local_28);
  QList<QLocale::Country>::reserve(this,(qsizetype)asize);
  local_30.i = (QLocale *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QLocale>::begin(in_stack_ffffffffffffff50);
  o = QList<QLocale>::end(in_stack_ffffffffffffff50);
  while (bVar1 = QList<QLocale>::const_iterator::operator!=(&local_30,o), bVar1) {
    QList<QLocale>::const_iterator::operator*(&local_30);
    territory((QLocale *)0x4d1c29);
    QList<QLocale::Country>::append((QList<QLocale::Country> *)0x4d1c42,in_stack_ffffffffffffff4e);
    QList<QLocale>::const_iterator::operator++(&local_30);
  }
  QList<QLocale>::~QList((QList<QLocale> *)0x4d1ca8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QLocale::Country> QLocale::countriesForLanguage(Language language)
{
    const auto locales = matchingLocales(language, AnyScript, AnyCountry);
    QList<Country> result;
    result.reserve(locales.size());
    for (const auto &locale : locales)
        result.append(locale.territory());
    return result;
}